

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trigonometric.hpp
# Opt level: O0

ScalarType
mt::angle<mt::Vector3<mt::Dual<float>>>(Vector3<mt::Dual<float>_> *v1,Vector3<mt::Dual<float>_> *v2)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  float local_800;
  float local_7fc;
  undefined8 local_7f0;
  undefined8 local_7e8;
  ulong local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  Vector3<mt::Dual<float>_> *local_7c0;
  Vector3<mt::Dual<float>_> *v2_local;
  Vector3<mt::Dual<float>_> *v1_local;
  undefined8 local_7a8;
  undefined8 local_7a0;
  undefined8 local_798;
  undefined8 local_790;
  Vector3<mt::Dual<float>_> *local_788;
  Vector3<mt::Dual<float>_> *local_780;
  undefined8 local_778;
  float *local_770;
  ScalarType local_768;
  Dual<float> *local_750;
  Dual<float> *local_748;
  undefined8 local_740;
  float local_738;
  float local_734;
  undefined8 *local_730;
  Dual<float> *local_728;
  Dual<float> *local_720;
  undefined8 local_718;
  float local_710;
  float local_70c;
  undefined8 *local_708;
  Vector3<mt::Dual<float>_> *local_700;
  Vector3<mt::Dual<float>_> *local_6f8;
  undefined8 local_6f0;
  float local_6e8;
  float local_6e4;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 local_6c8;
  float local_6c0;
  float local_6bc;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 local_6a0;
  float local_698;
  float local_694;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  Vector3<mt::Dual<float>_> *local_648;
  Vector3<mt::Dual<float>_> *local_640;
  Vector3<mt::Dual<float>_> *local_638;
  Vector3<mt::Dual<float>_> *local_630;
  Dual<float> *local_628;
  Dual<float> *local_620;
  Dual<float> *local_618;
  Dual<float> *local_610;
  Dual<float> *local_608;
  Dual<float> *local_600;
  Dual<float> *local_5f8;
  Dual<float> *local_5f0;
  float *local_5e8;
  float *local_5e0;
  float *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 *local_5b8;
  Vector3<mt::Dual<float>_> *local_5b0;
  Vector3<mt::Dual<float>_> *local_5a8;
  Dual<float> *local_5a0;
  Dual<float> *local_598;
  Dual<float> *local_590;
  Dual<float> *local_588;
  float *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 local_568;
  float local_560;
  float local_55c;
  undefined8 *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  undefined8 local_520;
  float local_518;
  float local_514;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  undefined8 local_4e8;
  float local_4e0;
  float local_4dc;
  ulong local_4d8;
  ulong local_4d0;
  undefined8 local_4c8;
  undefined4 local_4c0;
  undefined4 local_4bc;
  float *local_4b8;
  Vector3<mt::Dual<float>_> *local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  Vector3<mt::Dual<float>_> *local_480;
  Vector3<mt::Dual<float>_> *local_478;
  undefined8 local_470;
  Dual<float> *local_468;
  Dual<float> *local_460;
  undefined8 local_458;
  float local_450;
  float local_44c;
  undefined8 *local_448;
  Dual<float> *local_440;
  Dual<float> *local_438;
  undefined8 local_430;
  float local_428;
  float local_424;
  undefined8 *local_420;
  Vector3<mt::Dual<float>_> *local_418;
  Vector3<mt::Dual<float>_> *local_410;
  undefined8 local_408;
  float local_400;
  float local_3fc;
  undefined8 *local_3f8;
  Vector3<mt::Dual<float>_> *local_3f0;
  Vector3<mt::Dual<float>_> *local_3e8;
  Vector3<mt::Dual<float>_> *local_3e0;
  Vector3<mt::Dual<float>_> *local_3d8;
  Dual<float> *local_3d0;
  Dual<float> *local_3c8;
  Dual<float> *local_3c0;
  Dual<float> *local_3b8;
  Dual<float> *local_3b0;
  Dual<float> *local_3a8;
  Dual<float> *local_3a0;
  Dual<float> *local_398;
  Vector3<mt::Dual<float>_> *local_390;
  Vector3<mt::Dual<float>_> *local_388;
  Dual<float> *local_380;
  Dual<float> *local_378;
  Dual<float> *local_370;
  Dual<float> *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 local_350;
  float local_348;
  float local_344;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 local_308;
  float local_300;
  float local_2fc;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  Vector3<mt::Dual<float>_> *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  Vector3<mt::Dual<float>_> *local_2a0;
  Vector3<mt::Dual<float>_> *local_298;
  undefined8 local_290;
  Dual<float> *local_288;
  Dual<float> *local_280;
  undefined8 local_278;
  float local_270;
  float local_26c;
  undefined8 *local_268;
  Dual<float> *local_260;
  Dual<float> *local_258;
  undefined8 local_250;
  float local_248;
  float local_244;
  undefined8 *local_240;
  Vector3<mt::Dual<float>_> *local_238;
  Vector3<mt::Dual<float>_> *local_230;
  undefined8 local_228;
  float local_220;
  float local_21c;
  undefined8 *local_218;
  Vector3<mt::Dual<float>_> *local_210;
  Vector3<mt::Dual<float>_> *local_208;
  Vector3<mt::Dual<float>_> *local_200;
  Vector3<mt::Dual<float>_> *local_1f8;
  Dual<float> *local_1f0;
  Dual<float> *local_1e8;
  Dual<float> *local_1e0;
  Dual<float> *local_1d8;
  Dual<float> *local_1d0;
  Dual<float> *local_1c8;
  Dual<float> *local_1c0;
  Dual<float> *local_1b8;
  Vector3<mt::Dual<float>_> *local_1b0;
  Vector3<mt::Dual<float>_> *local_1a8;
  Dual<float> *local_1a0;
  Dual<float> *local_198;
  Dual<float> *local_190;
  Dual<float> *local_188;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 local_170;
  float local_168;
  float local_164;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 local_128;
  float local_120;
  float local_11c;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  ulong local_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 *local_d8;
  ulong *local_d0;
  undefined4 *local_c8;
  ulong *local_c0;
  undefined4 *local_b8;
  ulong *local_b0;
  undefined4 *local_a8;
  float local_a0;
  float local_9c;
  RT x_1;
  RT r;
  float *local_90;
  undefined8 local_88;
  float local_80;
  float local_7c;
  undefined8 *local_78;
  float *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  float *local_58;
  float local_4c;
  ulong *puStack_48;
  float x;
  undefined8 local_40;
  float local_38;
  float local_34;
  undefined8 *local_30;
  ulong *local_28;
  ulong *local_20;
  float local_18;
  undefined4 local_14;
  undefined4 local_10;
  float local_c;
  
  local_6e4 = (v1->x).mReal * (v2->x).mReal;
  local_6e8 = (v1->x).mReal * (v2->x).mDual + (v1->x).mDual * (v2->x).mReal;
  local_6e0 = &local_6f0;
  local_6f0._0_4_ = local_6e4;
  local_6f0._4_4_ = local_6e8;
  local_798 = local_6f0;
  uVar6 = local_798;
  local_720 = &v1->y;
  local_728 = &v2->y;
  local_70c = local_720->mReal * local_728->mReal;
  local_710 = local_720->mReal * (v2->y).mDual + (v1->y).mDual * local_728->mReal;
  local_708 = &local_718;
  local_718._0_4_ = local_70c;
  local_718._4_4_ = local_710;
  local_7a0 = local_718;
  uVar5 = local_7a0;
  local_528 = &local_798;
  local_530 = &local_7a0;
  local_798._0_4_ = (float)local_6f0;
  local_7a0._0_4_ = (float)local_718;
  local_514 = (float)local_798 + (float)local_7a0;
  local_798._4_4_ = (float)((ulong)local_6f0 >> 0x20);
  local_7a0._4_4_ = (float)((ulong)local_718 >> 0x20);
  local_518 = local_798._4_4_ + local_7a0._4_4_;
  local_510 = &local_520;
  local_520._0_4_ = local_514;
  local_520._4_4_ = local_518;
  local_790 = local_520;
  uVar7 = local_790;
  local_748 = &v1->z;
  local_750 = &v2->z;
  local_734 = local_748->mReal * local_750->mReal;
  local_738 = local_748->mReal * (v2->z).mDual + (v1->z).mDual * local_750->mReal;
  local_730 = &local_740;
  local_740._0_4_ = local_734;
  local_740._4_4_ = local_738;
  local_7a8 = local_740;
  uVar4 = local_7a8;
  local_570 = &local_790;
  local_578 = &local_7a8;
  local_790._0_4_ = (float)local_520;
  local_7a8._0_4_ = (float)local_740;
  local_55c = (float)local_790 + (float)local_7a8;
  local_790._4_4_ = (float)((ulong)local_520 >> 0x20);
  local_7a8._4_4_ = (float)((ulong)local_740 >> 0x20);
  local_560 = local_790._4_4_ + local_7a8._4_4_;
  local_558 = &local_568;
  local_568._0_4_ = local_55c;
  local_568._4_4_ = local_560;
  local_778 = local_568;
  local_7d0 = local_568;
  local_21c = (v1->x).mReal * (v1->x).mReal;
  local_220 = (v1->x).mReal * (v1->x).mDual + (v1->x).mDual * (v1->x).mReal;
  local_218 = &local_228;
  local_228._0_4_ = local_21c;
  local_228._4_4_ = local_220;
  local_2b0 = local_228;
  uVar14 = local_2b0;
  local_258 = &v1->y;
  local_260 = &v1->y;
  local_244 = local_258->mReal * local_260->mReal;
  local_248 = local_258->mReal * (v1->y).mDual + (v1->y).mDual * local_260->mReal;
  local_240 = &local_250;
  local_250._0_4_ = local_244;
  local_250._4_4_ = local_248;
  local_2b8 = local_250;
  uVar13 = local_2b8;
  local_130 = &local_2b0;
  local_138 = &local_2b8;
  local_2b0._0_4_ = (float)local_228;
  local_2b8._0_4_ = (float)local_250;
  local_11c = (float)local_2b0 + (float)local_2b8;
  local_2b0._4_4_ = (float)((ulong)local_228 >> 0x20);
  local_2b8._4_4_ = (float)((ulong)local_250 >> 0x20);
  local_120 = local_2b0._4_4_ + local_2b8._4_4_;
  local_118 = &local_128;
  local_128._0_4_ = local_11c;
  local_128._4_4_ = local_120;
  local_2a8 = local_128;
  uVar15 = local_2a8;
  local_280 = &v1->z;
  local_288 = &v1->z;
  local_26c = local_280->mReal * local_288->mReal;
  local_270 = local_280->mReal * (v1->z).mDual + (v1->z).mDual * local_288->mReal;
  local_268 = &local_278;
  local_278._0_4_ = local_26c;
  local_278._4_4_ = local_270;
  local_2c0 = local_278;
  uVar12 = local_2c0;
  local_178 = &local_2a8;
  local_180 = &local_2c0;
  local_2a8._0_4_ = (float)local_128;
  local_2c0._0_4_ = (float)local_278;
  local_164 = (float)local_2a8 + (float)local_2c0;
  local_2a8._4_4_ = (float)((ulong)local_128 >> 0x20);
  local_2c0._4_4_ = (float)((ulong)local_278 >> 0x20);
  local_168 = local_2a8._4_4_ + local_2c0._4_4_;
  local_160 = &local_170;
  local_170._0_4_ = local_164;
  local_170._4_4_ = local_168;
  local_290 = local_170;
  local_2c8 = local_170;
  local_7e8 = local_170;
  uVar3 = local_7e8;
  local_3fc = (v2->x).mReal * (v2->x).mReal;
  local_400 = (v2->x).mReal * (v2->x).mDual + (v2->x).mDual * (v2->x).mReal;
  local_3f8 = &local_408;
  local_408._0_4_ = local_3fc;
  local_408._4_4_ = local_400;
  local_490 = local_408;
  uVar10 = local_490;
  local_438 = &v2->y;
  local_440 = &v2->y;
  local_424 = local_438->mReal * local_440->mReal;
  local_428 = local_438->mReal * (v2->y).mDual + (v2->y).mDual * local_440->mReal;
  local_420 = &local_430;
  local_430._0_4_ = local_424;
  local_430._4_4_ = local_428;
  local_498 = local_430;
  uVar9 = local_498;
  local_310 = &local_490;
  local_318 = &local_498;
  local_490._0_4_ = (float)local_408;
  local_498._0_4_ = (float)local_430;
  local_2fc = (float)local_490 + (float)local_498;
  local_490._4_4_ = (float)((ulong)local_408 >> 0x20);
  local_498._4_4_ = (float)((ulong)local_430 >> 0x20);
  local_300 = local_490._4_4_ + local_498._4_4_;
  local_2f8 = &local_308;
  local_308._0_4_ = local_2fc;
  local_308._4_4_ = local_300;
  local_488 = local_308;
  uVar11 = local_488;
  local_460 = &v2->z;
  local_468 = &v2->z;
  local_44c = local_460->mReal * local_468->mReal;
  local_450 = local_460->mReal * (v2->z).mDual + (v2->z).mDual * local_468->mReal;
  local_448 = &local_458;
  local_458._0_4_ = local_44c;
  local_458._4_4_ = local_450;
  local_4a0 = local_458;
  uVar8 = local_4a0;
  local_358 = &local_488;
  local_360 = &local_4a0;
  local_488._0_4_ = (float)local_308;
  local_4a0._0_4_ = (float)local_458;
  local_344 = (float)local_488 + (float)local_4a0;
  local_488._4_4_ = (float)((ulong)local_308 >> 0x20);
  local_4a0._4_4_ = (float)((ulong)local_458 >> 0x20);
  local_348 = local_488._4_4_ + local_4a0._4_4_;
  local_340 = &local_350;
  local_350._0_4_ = local_344;
  local_350._4_4_ = local_348;
  local_470 = local_350;
  local_4a8 = local_350;
  local_7f0 = local_350;
  uVar2 = local_7f0;
  local_6a8 = &local_7e8;
  local_6b0 = &local_7f0;
  local_7e8._0_4_ = (float)local_170;
  local_7f0._0_4_ = (float)local_350;
  local_694 = (float)local_7e8 * (float)local_7f0;
  local_7f0._4_4_ = (float)((ulong)local_350 >> 0x20);
  local_7e8._4_4_ = (float)((ulong)local_170 >> 0x20);
  local_698 = (float)local_7e8 * local_7f0._4_4_ + local_7e8._4_4_ * (float)local_7f0;
  local_690 = &local_6a0;
  local_6a0._0_4_ = local_694;
  local_6a0._4_4_ = local_698;
  local_7e0 = local_6a0;
  local_4d0 = local_6a0;
  local_4d8 = local_6a0;
  local_e8 = local_6a0;
  uVar16 = local_e8;
  local_d8 = &local_f0;
  local_dc = 0;
  local_e0 = 0;
  local_f0 = 0;
  local_ec = 0;
  local_c8 = &local_f0;
  local_d0 = &local_e8;
  local_e8._0_4_ = (float)local_6a0;
  local_7f0 = uVar2;
  local_7e8 = uVar3;
  local_7c0 = v2;
  v2_local = v1;
  local_7a8 = uVar4;
  local_7a0 = uVar5;
  local_798 = uVar6;
  local_790 = uVar7;
  local_788 = v2;
  local_780 = v1;
  local_700 = v2;
  local_6f8 = v1;
  local_688 = local_6b0;
  local_680 = local_6a8;
  local_678 = local_6b0;
  local_670 = local_6a8;
  local_648 = v2;
  local_640 = v1;
  local_638 = v2;
  local_630 = v1;
  local_628 = local_728;
  local_620 = local_720;
  local_618 = local_728;
  local_610 = local_720;
  local_608 = local_750;
  local_600 = local_748;
  local_5f8 = local_750;
  local_5f0 = local_748;
  local_5d0 = local_6a8;
  local_5c8 = local_6b0;
  local_5b0 = v1;
  local_5a8 = v2;
  local_5a0 = local_720;
  local_598 = local_728;
  local_590 = local_748;
  local_588 = local_750;
  local_550 = local_578;
  local_548 = local_570;
  local_540 = local_578;
  local_538 = local_570;
  local_508 = local_530;
  local_500 = local_528;
  local_4f8 = local_530;
  local_4f0 = local_528;
  local_4b0 = v2;
  local_4a0 = uVar8;
  local_498 = uVar9;
  local_490 = uVar10;
  local_488 = uVar11;
  local_480 = v2;
  local_478 = v2;
  local_418 = v2;
  local_410 = v2;
  local_3f0 = v2;
  local_3e8 = v2;
  local_3e0 = v2;
  local_3d8 = v2;
  local_3d0 = local_440;
  local_3c8 = local_438;
  local_3c0 = local_440;
  local_3b8 = local_438;
  local_3b0 = local_468;
  local_3a8 = local_460;
  local_3a0 = local_468;
  local_398 = local_460;
  local_390 = v2;
  local_388 = v2;
  local_380 = local_438;
  local_378 = local_440;
  local_370 = local_460;
  local_368 = local_468;
  local_338 = local_360;
  local_330 = local_358;
  local_328 = local_360;
  local_320 = local_358;
  local_2f0 = local_318;
  local_2e8 = local_310;
  local_2e0 = local_318;
  local_2d8 = local_310;
  local_2d0 = v1;
  local_2c0 = uVar12;
  local_2b8 = uVar13;
  local_2b0 = uVar14;
  local_2a8 = uVar15;
  local_2a0 = v1;
  local_298 = v1;
  local_238 = v1;
  local_230 = v1;
  local_210 = v1;
  local_208 = v1;
  local_200 = v1;
  local_1f8 = v1;
  local_1f0 = local_260;
  local_1e8 = local_258;
  local_1e0 = local_260;
  local_1d8 = local_258;
  local_1d0 = local_288;
  local_1c8 = local_280;
  local_1c0 = local_288;
  local_1b8 = local_280;
  local_1b0 = v1;
  local_1a8 = v1;
  local_1a0 = local_258;
  local_198 = local_260;
  local_190 = local_280;
  local_188 = local_288;
  local_158 = local_180;
  local_150 = local_178;
  local_148 = local_180;
  local_140 = local_178;
  local_110 = local_138;
  local_108 = local_130;
  local_100 = local_138;
  local_f8 = local_130;
  local_e8 = uVar16;
  local_c0 = local_d0;
  local_b8 = local_c8;
  local_b0 = local_d0;
  local_a8 = local_c8;
  if ((float)local_e8 <= 0.0) {
    __assert_fail("ispositive(a)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/erwincoumans[P]motion-toolkit/moto/Scalar.hpp"
                  ,0x112,"Scalar mt::rsqrt(Scalar) [Scalar = mt::Dual<float>]");
  }
  local_4bc = 0x3f800000;
  local_4c0 = 0;
  local_4e0 = 1.0;
  local_4dc = 0.0;
  puStack_48 = &local_4d0;
  local_4b8 = &local_4e0;
  local_28 = puStack_48;
  dVar17 = std::sqrt((double)(local_6a0 & 0xffffffff));
  local_4c = SUB84(dVar17,0);
  local_20 = puStack_48;
  local_38 = *(float *)((long)puStack_48 + 4) / (local_4c + local_4c);
  local_30 = &local_40;
  local_40._0_4_ = local_4c;
  local_40._4_4_ = local_38;
  local_4e8 = local_40;
  uVar4 = local_4e8;
  _x_1 = &local_4e8;
  local_4e8._0_4_ = (float)local_40;
  local_9c = 1.0 / (float)local_4e8;
  local_a0 = local_4e0 * local_9c;
  local_4e8._4_4_ = (float)((ulong)local_40 >> 0x20);
  local_80 = (local_4dc - local_a0 * local_4e8._4_4_) * local_9c;
  local_78 = &local_88;
  local_88._0_4_ = local_a0;
  local_88._4_4_ = local_80;
  local_4c8 = local_88;
  local_7d8 = local_88;
  uVar2 = local_7d8;
  local_6d0 = &local_7d0;
  local_6d8 = &local_7d8;
  local_7d8._0_4_ = (float)local_88;
  local_6bc = (float)local_7d0 * (float)local_7d8;
  local_7d8._4_4_ = (float)((ulong)local_88 >> 0x20);
  local_6c0 = (float)local_7d0 * local_7d8._4_4_ + local_7d0._4_4_ * (float)local_7d8;
  local_6b8 = &local_6c8;
  local_6c8._0_4_ = local_6bc;
  local_6c8._4_4_ = local_6c0;
  local_7c8 = local_6c8;
  uVar3 = local_7c8;
  local_770 = (float *)&local_7c8;
  local_7c8._0_4_ = (float)local_6c8;
  local_18 = (float)local_7c8;
  local_10 = 0xbf800000;
  local_14 = 0x3f800000;
  if ((float)local_7c8 < -1.0) {
    local_7fc = -1.0;
  }
  else {
    local_800 = local_18;
    if (1.0 < (float)local_7c8) {
      local_800 = 1.0;
    }
    local_7fc = local_800;
  }
  local_7d8 = uVar2;
  local_7c8 = uVar3;
  local_668 = local_6d8;
  local_660 = local_6d0;
  local_658 = local_6d8;
  local_650 = local_6d0;
  local_5d8 = local_770;
  local_5c0 = local_6d0;
  local_5b8 = local_6d8;
  local_4e8 = uVar4;
  local_90 = &local_4e0;
  local_7c = local_a0;
  local_70 = &local_4e0;
  local_68 = _x_1;
  local_60 = _x_1;
  local_58 = &local_4e0;
  local_34 = local_4c;
  local_c = local_18;
  dVar17 = std::acos((double)(ulong)(uint)local_7fc);
  local_580 = local_770;
  fVar1 = local_770[1];
  local_5e0 = local_770;
  local_5e8 = local_770;
  dVar18 = std::sqrt((double)(ulong)(uint)(1.0 - *local_770 * *local_770));
  local_768.mReal = (float)SUB84(dVar17,0);
  local_768.mDual = -fVar1 / SUB84(dVar18,0);
  return local_768;
}

Assistant:

typename Vector::ScalarType angle(const Vector& v1, const Vector& v2)
    {
        return acos(dot(v1, v2) * rsqrt(lengthSquared(v1) * lengthSquared(v2)));
    }